

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O0

BasicStringView<char> __thiscall
Corrade::Containers::BasicStringView<char>::findLastOr
          (BasicStringView<char> *this,char character,char *fail)

{
  size_t size;
  char *pcVar1;
  char *found;
  char *fail_local;
  char character_local;
  BasicStringView<char> *this_local;
  
  pcVar1 = this->_data;
  size = BasicStringView<char>::size(this);
  pcVar1 = Implementation::stringFindLastCharacter(pcVar1,size,character);
  if (pcVar1 == (char *)0x0) {
    BasicStringView((BasicStringView<char> *)&this_local,fail,0,(nullptr_t)0x0);
  }
  else {
    _this_local = slice(this,pcVar1,pcVar1 + 1);
  }
  return _this_local;
}

Assistant:

inline BasicStringView<T> BasicStringView<T>::findLastOr(const char character, T* const fail) const {
    if(const char* const found = Implementation::stringFindLastCharacter(_data, size(), character))
        return slice(const_cast<T*>(found), const_cast<T*>(found + 1));

    /* Using an internal assert-less constructor, the public constructor
       asserts would be redundant. Since it's a zero-sized view, it doesn't
       really make sense to try to preserve any flags. */
    return BasicStringView<T>{fail, 0 /* empty, no flags */, nullptr};
}